

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfDeepScanLineInputFile.cpp
# Opt level: O0

void __thiscall Imf_3_2::DeepScanLineInputFile::Data::Data(Data *this,int numThreads)

{
  V2f *screenWindowCenter;
  size_type sVar1;
  reference ppLVar2;
  int in_ESI;
  long in_RDI;
  Array<unsigned_int> *this_00;
  Array<bool> *this_01;
  size_t i;
  DeepFrameBuffer *in_stack_ffffffffffffff70;
  undefined8 in_stack_ffffffffffffff98;
  Compression compression;
  undefined8 in_stack_ffffffffffffffa0;
  Vec2<float> *this_02;
  Header *in_stack_ffffffffffffffc0;
  ulong local_38;
  int local_2c [6];
  Vec2<float> local_14;
  int local_c;
  
  compression = (Compression)((ulong)in_stack_ffffffffffffff98 >> 0x20);
  local_c = in_ESI;
  std::mutex::mutex((mutex *)0x194b18);
  screenWindowCenter = (V2f *)(in_RDI + 0x28);
  this_02 = &local_14;
  Imath_3_2::Vec2<float>::Vec2(this_02,0.0,0.0);
  Header::Header(in_stack_ffffffffffffffc0,(int)((ulong)in_RDI >> 0x20),(int)in_RDI,
                 (float)((ulong)this_02 >> 0x20),screenWindowCenter,
                 (float)((ulong)in_stack_ffffffffffffffa0 >> 0x20),
                 (LineOrder)in_stack_ffffffffffffffa0,compression);
  DeepFrameBuffer::DeepFrameBuffer(in_stack_ffffffffffffff70);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)0x194b93);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)0x194ba9);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)0x194bbf);
  std::
  vector<Imf_3_2::(anonymous_namespace)::InSliceInfo_*,_std::allocator<Imf_3_2::(anonymous_namespace)::InSliceInfo_*>_>
  ::vector((vector<Imf_3_2::(anonymous_namespace)::InSliceInfo_*,_std::allocator<Imf_3_2::(anonymous_namespace)::InSliceInfo_*>_>
            *)0x194bd5);
  std::
  vector<Imf_3_2::(anonymous_namespace)::LineBuffer_*,_std::allocator<Imf_3_2::(anonymous_namespace)::LineBuffer_*>_>
  ::vector((vector<Imf_3_2::(anonymous_namespace)::LineBuffer_*,_std::allocator<Imf_3_2::(anonymous_namespace)::LineBuffer_*>_>
            *)0x194beb);
  *(undefined4 *)(in_RDI + 0x16c) = 0xffffffff;
  *(int *)(in_RDI + 0x170) = local_c;
  *(undefined1 *)(in_RDI + 0x174) = 0;
  *(undefined8 *)(in_RDI + 0x178) = 0;
  *(undefined1 *)(in_RDI + 0x180) = 0;
  *(undefined1 *)(in_RDI + 0x181) = 0;
  Array2D<unsigned_int>::Array2D((Array2D<unsigned_int> *)(in_RDI + 0x188));
  this_00 = (Array<unsigned_int> *)(in_RDI + 0x1a0);
  Array<unsigned_int>::Array(this_00);
  this_01 = (Array<bool> *)(in_RDI + 0x1b0);
  Array<bool>::Array(this_01);
  *(undefined1 *)(in_RDI + 0x1d0) = 0;
  Array<char>::Array((Array<char> *)(in_RDI + 0x1d8));
  *(undefined8 *)(in_RDI + 0x1f8) = 0;
  *(undefined1 *)(in_RDI + 0x200) = 0;
  local_2c[1] = 1;
  local_2c[0] = local_c * 2;
  std::max<int>(local_2c + 1,local_2c);
  std::
  vector<Imf_3_2::(anonymous_namespace)::LineBuffer_*,_std::allocator<Imf_3_2::(anonymous_namespace)::LineBuffer_*>_>
  ::resize((vector<Imf_3_2::(anonymous_namespace)::LineBuffer_*,_std::allocator<Imf_3_2::(anonymous_namespace)::LineBuffer_*>_>
            *)this_00,(size_type)this_01);
  local_38 = 0;
  while( true ) {
    sVar1 = std::
            vector<Imf_3_2::(anonymous_namespace)::LineBuffer_*,_std::allocator<Imf_3_2::(anonymous_namespace)::LineBuffer_*>_>
            ::size((vector<Imf_3_2::(anonymous_namespace)::LineBuffer_*,_std::allocator<Imf_3_2::(anonymous_namespace)::LineBuffer_*>_>
                    *)(in_RDI + 0x150));
    if (sVar1 <= local_38) break;
    ppLVar2 = std::
              vector<Imf_3_2::(anonymous_namespace)::LineBuffer_*,_std::allocator<Imf_3_2::(anonymous_namespace)::LineBuffer_*>_>
              ::operator[]((vector<Imf_3_2::(anonymous_namespace)::LineBuffer_*,_std::allocator<Imf_3_2::(anonymous_namespace)::LineBuffer_*>_>
                            *)(in_RDI + 0x150),local_38);
    *ppLVar2 = (value_type)0x0;
    local_38 = local_38 + 1;
  }
  *(undefined8 *)(in_RDI + 0x1e8) = 0;
  return;
}

Assistant:

DeepScanLineInputFile::Data::Data (int numThreads)
    : partNumber (-1)
    , numThreads (numThreads)
    , multiPartBackwardSupport (false)
    , multiPartFile (NULL)
    , memoryMapped (false)
    , bigFile (false)
    , frameBufferValid (false)
    , _streamData (NULL)
    , _deleteStream (false)
{
    //
    // We need at least one lineBuffer, but if threading is used,
    // to keep n threads busy we need 2*n lineBuffers
    //

    lineBuffers.resize (max (1, 2 * numThreads));

    for (size_t i = 0; i < lineBuffers.size (); i++)
        lineBuffers[i] = 0;

    sampleCountTableComp = 0;
}